

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duhtag.c
# Opt level: O1

char * duh_get_tag(DUH *duh,char *key)

{
  int iVar1;
  char *(*papcVar2) [2];
  int iVar3;
  long lVar4;
  
  if (((duh != (DUH *)0x0) && (papcVar2 = duh->tag, papcVar2 != (char *(*) [2])0x0)) &&
     (iVar1 = duh->n_tags, 0 < (long)iVar1)) {
    lVar4 = 0;
    do {
      iVar3 = strcmp(key,*(char **)((long)*papcVar2 + lVar4));
      if (iVar3 == 0) {
        return *(char **)((long)*papcVar2 + lVar4 + 8);
      }
      lVar4 = lVar4 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar4);
  }
  return (char *)0x0;
}

Assistant:

const char *DUMBEXPORT duh_get_tag(DUH *duh, const char *key)
{
	int i;
	ASSERT(key);
	if (!duh || !duh->tag) return NULL;

	for (i = 0; i < duh->n_tags; i++)
		if (strcmp(key, duh->tag[i][0]) == 0)
			return duh->tag[i][1];

	return NULL;
}